

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

void evutil_freeaddrinfo(addrinfo *ai)

{
  addrinfo *paVar1;
  addrinfo *next;
  addrinfo *ai_local;
  
  next = ai;
  if ((ai->ai_flags & 0x80000000U) == 0) {
    freeaddrinfo((addrinfo *)ai);
  }
  else {
    while (next != (addrinfo *)0x0) {
      paVar1 = next->ai_next;
      if (next->ai_canonname != (char *)0x0) {
        event_mm_free_(next->ai_canonname);
      }
      event_mm_free_(next);
      next = paVar1;
    }
  }
  return;
}

Assistant:

void
evutil_freeaddrinfo(struct evutil_addrinfo *ai)
{
#ifdef EVENT__HAVE_GETADDRINFO
	if (!(ai->ai_flags & EVUTIL_AI_LIBEVENT_ALLOCATED)) {
		freeaddrinfo(ai);
		return;
	}
#endif
	while (ai) {
		struct evutil_addrinfo *next = ai->ai_next;
		if (ai->ai_canonname)
			mm_free(ai->ai_canonname);
		mm_free(ai);
		ai = next;
	}
}